

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O1

void Cudd_RecursiveDerefZdd(DdManager *table,DdNode *n)

{
  DdHalfWord *pDVar1;
  uint *puVar2;
  int iVar3;
  DdNode **ppDVar4;
  int iVar5;
  anon_union_16_2_50f58667_for_type *paVar6;
  
  ppDVar4 = table->stack;
  iVar5 = 1;
  do {
    pDVar1 = &n->ref;
    *pDVar1 = *pDVar1 - 1;
    if (*pDVar1 == 0) {
      table->deadZ = table->deadZ + 1;
      iVar3 = table->permZ[n->index];
      paVar6 = &n->type;
      ppDVar4[iVar5] = (n->type).kids.E;
      puVar2 = &table->subtableZ[iVar3].dead;
      *puVar2 = *puVar2 + 1;
      iVar5 = iVar5 + 1;
    }
    else {
      paVar6 = (anon_union_16_2_50f58667_for_type *)(ppDVar4 + (long)iVar5 + -1);
      iVar5 = iVar5 + -1;
    }
    n = (paVar6->kids).T;
  } while (iVar5 != 0);
  return;
}

Assistant:

void
Cudd_RecursiveDerefZdd(
  DdManager * table,
  DdNode * n)
{
    DdNode *N;
    int ord;
    DdNodePtr *stack = table->stack;
    int SP = 1;

    N = n;

    do {
#ifdef DD_DEBUG
        assert(N->ref != 0);
#endif

        cuddSatDec(N->ref);
    
        if (N->ref == 0) {
            table->deadZ++;
#ifdef DD_STATS
            table->nodesDropped++;
#endif
#ifdef DD_DEBUG
            assert(!cuddIsConstant(N));
#endif
            ord = table->permZ[N->index];
            stack[SP++] = cuddE(N);
            table->subtableZ[ord].dead++;
            N = cuddT(N);
        } else {
            N = stack[--SP];
        }
    } while (SP != 0);

}